

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcodeEan8.cpp
# Opt level: O1

uint32_t BarcodeEan8::intToBarcode(uint32_t value,uint8_t *barcode)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  
  uVar8 = (ulong)value;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar8 / 1000000;
  lVar10 = uVar8 / 1000000 + (ulong)(uint)(SUB164(auVar2 * ZEXT816(0x199999999999999a),8) * 2) * -5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8 / 100000;
  lVar15 = uVar8 / 100000 + (ulong)(uint)(SUB164(auVar3 * ZEXT816(0x199999999999999a),8) * 2) * -5;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar8 / 10000;
  lVar17 = uVar8 / 10000 + (ulong)(uint)(SUB164(auVar4 * ZEXT816(0x199999999999999a),8) * 2) * -5;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar8 / 1000;
  lVar19 = uVar8 / 1000 + (ulong)(uint)(SUB164(auVar5 * ZEXT816(0x199999999999999a),8) * 2) * -5;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar8 / 100;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar8 / 10;
  lVar20 = uVar8 / 100 + (ulong)(uint)(SUB164(auVar6 * ZEXT816(0x199999999999999a),8) * 2) * -5;
  lVar12 = uVar8 / 10 + (ulong)(uint)(SUB164(auVar7 * ZEXT816(0x199999999999999a),8) * 2) * -5;
  uVar13 = (value % 10 + (int)lVar10 + (int)lVar17 + (int)lVar20) * 3 +
           (int)lVar15 + (int)lVar19 + (int)lVar12;
  uVar13 = ((uVar13 / 10) * 10 - uVar13) + 10;
  uVar9 = (uint)"\r\x19\x13=#1/;7\v"[lVar15] << 7 | (uint)"\r\x19\x13=#1/;7\v"[lVar10] << 0xe;
  bVar1 = "\r\x19\x13=#1/;7\v"[lVar19];
  uVar14 = (ulong)"rflB\\NPDHt"[lVar20] << 0xe |
           (ulong)("\r\x19\x13=#1/;7\v"[lVar17] | uVar9) << 0x21 | (ulong)bVar1 << 0x1a;
  uVar11 = (ulong)"rflB\\NPDHt"[value % 10] | (ulong)"rflB\\NPDHt"[lVar12] << 7;
  uVar16 = uVar11 | uVar14;
  uVar8 = (ulong)"rflB\\NPDHt"[uVar13 + (int)((ulong)uVar13 * 0x1999999a >> 0x20) * -10] |
          uVar16 << 7;
  uVar18 = uVar8 | 0xa0000000a0000000;
  *barcode = (uint8_t)(uVar18 >> 0x38);
  barcode[1] = (uint8_t)(uVar9 >> 8);
  barcode[2] = (uint8_t)(uVar14 >> 0x21);
  barcode[3] = bVar1 * '\x02';
  barcode[4] = (uint8_t)(uVar18 >> 0x18);
  barcode[5] = (uint8_t)(uVar16 >> 9);
  barcode[6] = (uint8_t)(uVar11 >> 1);
  barcode[7] = (uint8_t)uVar8;
  barcode[8] = 0xa0;
  return 0x43;
}

Assistant:

uint32_t BarcodeEan8::intToBarcode(const uint32_t value, uint8_t barcode[9])
{
   uint8_t digit[8];
   uint32_t oddDigits;
   uint32_t evenDigits;
   uint32_t remainder;
   uint64_t helper;

   //get 7 decimal digits
   digit[0] = (value / (1000000uL)) % 10;
   digit[1] = (value / (100000uL)) % 10;
   digit[2] = (value / (10000uL)) % 10;
   digit[3] = (value / (1000uL)) % 10;
   digit[4] = (value / (100uL)) % 10;
   digit[5] = (value / (10uL)) % 10;
   digit[6] = value % 10;

   //checksum digit
   oddDigits = digit[6] + digit[4] + digit[2] + digit[0];
   evenDigits = digit[5] + digit[3] + digit[1];
   remainder = ((3 * oddDigits + evenDigits) % 10);
   digit[7] = (uint8_t)((10 - remainder) % 10);

   //encode into barcode

   //use 64-bit helper variable
   //start marker
   helper = 0x05; //3bit
   //left digits
   helper = (helper << 7) | leftOddDigit[digit[0]];
   helper = (helper << 7) | leftOddDigit[digit[1]];
   helper = (helper << 7) | leftOddDigit[digit[2]];
   helper = (helper << 7) | leftOddDigit[digit[3]];
   //center marker
   helper = (helper << 5) | 0x0A; //5bit
   //right digits
   helper = (helper << 7) | rightDigit[digit[4]];
   helper = (helper << 7) | rightDigit[digit[5]];
   helper = (helper << 7) | rightDigit[digit[6]];
   helper = (helper << 7) | rightDigit[digit[7]];

   //copy into byte array
   barcode[0] = (uint8_t)(helper >> 56);
   barcode[1] = (uint8_t)(helper >> 48);
   barcode[2] = (uint8_t)(helper >> 40);
   barcode[3] = (uint8_t)(helper >> 32);
   barcode[4] = (uint8_t)(helper >> 24);
   barcode[5] = (uint8_t)(helper >> 16);
   barcode[6] = (uint8_t)(helper >> 8);
   barcode[7] = (uint8_t)helper;
   barcode[8] = 0x05 << 5; //add end marker


   //return length of barcode
   return (3 + 4*7 + 5 + 4*7 + 3); //3bit start, four 7-bit digits, 5 bit middle, 4 7-bit digits, 3bit end
}